

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.cpp
# Opt level: O2

void test_qclab_dense_transpose_complex<std::complex<float>>(void)

{
  complex<float> m31;
  complex<float> m31_00;
  complex<float> m31_01;
  complex<float> m33;
  complex<float> m33_00;
  complex<float> m33_01;
  complex<float> in_RCX;
  complex<float> cVar1;
  complex<float> in_RDX;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  pointer *__ptr;
  complex<float> in_RSI;
  complex<float> cVar2;
  complex<float> in_R8;
  complex<float> cVar3;
  char *pcVar4;
  AssertionResult gtest_ar_2;
  M m5;
  M m3;
  AssertHelper local_1c8;
  AssertionResult gtest_ar_7;
  M m2;
  AssertHelper local_1a0;
  M m1;
  M matrix2;
  M check2H;
  M check2T;
  M matrix1;
  M check2;
  M check1H;
  M check1T;
  M check1;
  
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&matrix1,in_RSI,in_RDX,in_RCX,in_R8);
  cVar2._M_value = 0x4180000000000000;
  cVar3._M_value = 0x4140000000000000;
  cVar1._M_value = 0x40e0000000000000;
  m31._M_value._1_7_ = gtest_ar_2._1_7_;
  m31._M_value._0_1_ = gtest_ar_2.success_;
  m33._M_value._1_7_ = m5.size_._1_7_;
  m33._M_value._0_1_ = (char)m5.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&matrix2,(complex<float>)0x4180000000000000,(complex<float>)0x4130000000000000,
             (complex<float>)0x40e0000000000000,(complex<float>)0x4140000000000000,
             (complex<float>)0x4100000000000000,(complex<float>)0x4040000000000000,
             (complex<float>)0x40e0000000000000,(complex<float>)0x4130000000000000,
             (complex<float>)0x4170000000000000,(complex<float>)0x4080000000000000,
             (complex<float>)0x4100000000000000,(complex<float>)0x4140000000000000,
             (complex<float>)0x4180000000000000,m31,
             (complex<float>)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,m33);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&check1,cVar2,m01,cVar1,cVar3);
  cVar2._M_value = 0x4180000000000000;
  cVar3._M_value = 0x4140000000000000;
  cVar1._M_value = 0x40e0000000000000;
  m31_00._M_value._1_7_ = gtest_ar_2._1_7_;
  m31_00._M_value._0_1_ = gtest_ar_2.success_;
  m33_00._M_value._1_7_ = m5.size_._1_7_;
  m33_00._M_value._0_1_ = (char)m5.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&check2,(complex<float>)0x4180000000000000,(complex<float>)0x4130000000000000,
             (complex<float>)0x40e0000000000000,(complex<float>)0x4140000000000000,
             (complex<float>)0x4100000000000000,(complex<float>)0x4040000000000000,
             (complex<float>)0x40e0000000000000,(complex<float>)0x4130000000000000,
             (complex<float>)0x4170000000000000,(complex<float>)0x4080000000000000,
             (complex<float>)0x4100000000000000,(complex<float>)0x4140000000000000,
             (complex<float>)0x4180000000000000,m31_00,
             (complex<float>)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,m33_00);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&check1T,cVar2,m01_00,cVar1,cVar3);
  cVar2._M_value = 0x4180000000000000;
  cVar3._M_value = 0x4170000000000000;
  cVar1._M_value = 0x4120000000000000;
  m31_01._M_value._1_7_ = gtest_ar_2._1_7_;
  m31_01._M_value._0_1_ = gtest_ar_2.success_;
  m33_01._M_value._1_7_ = m5.size_._1_7_;
  m33_01._M_value._0_1_ = (char)m5.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&check2T,(complex<float>)0x4180000000000000,(complex<float>)0x4130000000000000,
             (complex<float>)0x4120000000000000,(complex<float>)0x4170000000000000,
             (complex<float>)0x4160000000000000,(complex<float>)0x4110000000000000,
             (complex<float>)0x4120000000000000,(complex<float>)0x4130000000000000,
             (complex<float>)0x4140000000000000,(complex<float>)0x4150000000000000,
             (complex<float>)0x4160000000000000,(complex<float>)0x4170000000000000,
             (complex<float>)0x4180000000000000,m31_01,
             (complex<float>)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,m33_01);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&check1H,cVar2,m01_01,cVar1,cVar3);
  cVar2._M_value._1_7_ = gtest_ar_2._1_7_;
  cVar2._M_value._0_1_ = gtest_ar_2.success_;
  cVar3._M_value._1_7_ = m5.size_._1_7_;
  cVar3._M_value._0_1_ = (char)m5.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&check2H,(complex<float>)0xc180000000000000,(complex<float>)0xc130000000000000,
             (complex<float>)0xc120000000000000,(complex<float>)0xc170000000000000,
             (complex<float>)0xc160000000000000,(complex<float>)0xc110000000000000,
             (complex<float>)0xc120000000000000,(complex<float>)0xc130000000000000,
             (complex<float>)0xc140000000000000,(complex<float>)0xc150000000000000,
             (complex<float>)0xc160000000000000,(complex<float>)0xc170000000000000,
             (complex<float>)0xc180000000000000,cVar2,
             (complex<float>)
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,cVar3);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&m1,&matrix1);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(NoTrans,&m1);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m2,"m1","check1",&m1,&check1);
  if ((char)m2.size_ == '\0') {
    testing::Message::Message((Message *)&m3);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m2.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m2.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x76,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&m3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m2.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&m2,&matrix2);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(NoTrans,&m2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m3,"m2","check2",&m2,&check2);
  if ((char)m3.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m3.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m3.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.data_);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&m3,NoTrans,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&gtest_ar_2,"m3","check2",&m3,&check2);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&m5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&m5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m3.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m2.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m1.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&m1,&matrix1);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(Trans,&m1);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m2,"m1","check1T",&m1,&check1T);
  if ((char)m2.size_ == '\0') {
    testing::Message::Message((Message *)&m3);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m2.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m2.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&m3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m2.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&m2,&matrix2);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(Trans,&m2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m3,"m2","check2T",&m2,&check2T);
  if ((char)m3.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m3.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m3.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.data_);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&m3,Trans,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&gtest_ar_2,"m3","check2T",&m3,&check2T);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&m5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&m5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_2,&matrix2);
  qclab::dense::transInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m5,"m4","check2T",(SquareMatrix<std::complex<float>_> *)&gtest_ar_2,
             &check2T);
  if ((char)m5.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m5.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m5.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m5.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<float>>>((dense *)&m5,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&gtest_ar_7,"m5","check2T",&m5,&check2T);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1c8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m5.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &gtest_ar_2.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m3.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m2.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m1.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&m1,&matrix1);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(ConjTrans,&m1);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m2,"m1","check1H",&m1,&check1H);
  if ((char)m2.size_ == '\0') {
    testing::Message::Message((Message *)&m3);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m2.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m2.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&m3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m3.size_._1_7_,(char)m3.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m2.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&m2,&matrix2);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(ConjTrans,&m2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m3,"m2","check2H",&m2,&check2H);
  if ((char)m3.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m3.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m3.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.data_);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&m3,ConjTrans,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&gtest_ar_2,"m3","check2H",&m3,&check2H);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&m5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&m5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    if ((long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(m5.size_._1_7_,(char)m5.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_2,&matrix2);
  qclab::dense::conjTransInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&m5,"m4","check2H",(SquareMatrix<std::complex<float>_> *)&gtest_ar_2,
             &check2H);
  if ((char)m5.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_7);
    if ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
        m5.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)m5.data_._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x9b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m5.data_);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<float>>>((dense *)&m5,&matrix2);
  testing::internal::
  CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
            ((internal *)&gtest_ar_7,"m5","check2H",&m5,&check2H);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x9d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1c8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m5.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &gtest_ar_2.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m3.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m2.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&m1.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&check2H.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&check1H.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&check2T.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&check1T.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&check2.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&check1.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&matrix2.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&matrix1.data_);
  return;
}

Assistant:

void test_qclab_dense_transpose_complex() {

  using M = qclab::dense::SquareMatrix< T > ;

  M matrix1( T(1,5) , T(2,6) ,
             T(3,7) , T(4,8) ) ;
  M matrix2( T(0,1) , T(0,5) , T(0, 9) , T(0,13) ,
             T(0,2) , T(0,6) , T(0,10) , T(0,14) ,
             T(0,3) , T(0,7) , T(0,11) , T(0,15) ,
             T(0,4) , T(0,8) , T(0,12) , T(0,16) ) ;

  M check1( T(1,5) , T(2,6) ,
            T(3,7) , T(4,8) ) ;
  M check2( T(0,1) , T(0,5) , T(0, 9) , T(0,13) ,
            T(0,2) , T(0,6) , T(0,10) , T(0,14) ,
            T(0,3) , T(0,7) , T(0,11) , T(0,15) ,
            T(0,4) , T(0,8) , T(0,12) , T(0,16) ) ;

  M check1T( T(1,5) , T(3,7) ,
             T(2,6) , T(4,8) ) ;
  M check2T( T(0, 1) , T(0, 2) , T(0, 3) , T(0, 4) ,
             T(0, 5) , T(0, 6) , T(0, 7) , T(0, 8) ,
             T(0, 9) , T(0,10) , T(0,11) , T(0,12) ,
             T(0,13) , T(0,14) , T(0,15) , T(0,16) ) ;

  M check1H( T(1,-5) , T(3,-7) ,
             T(2,-6) , T(4,-8) ) ;
  M check2H( T(0, -1) , T(0, -2) , T(0, -3) , T(0, -4) ,
             T(0, -5) , T(0, -6) , T(0, -7) , T(0, -8) ,
             T(0, -9) , T(0,-10) , T(0,-11) , T(0,-12) ,
             T(0,-13) , T(0,-14) , T(0,-15) , T(0,-16) ) ;

  // NoTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m1 ) ;
    EXPECT_EQ( m1 , check1 ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m2 ) ;
    EXPECT_EQ( m2 , check2 ) ;
    M m3 = qclab::dense::operate( qclab::Op::NoTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2 ) ;
  }

  // Trans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::Trans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::transInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::trans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

  // ConjTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m1 ) ;
    EXPECT_EQ( m1 , check1H ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m2 ) ;
    EXPECT_EQ( m2 , check2H ) ;
    M m3 = qclab::dense::operate( qclab::Op::ConjTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2H ) ;
    M m4( matrix2 ) ;
    qclab::dense::conjTransInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2H ) ;
    M m5 = qclab::dense::conjTrans( matrix2 ) ;
    EXPECT_EQ( m5 , check2H ) ;
  }

}